

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::nullopt_t_const&>
          (BumpAllocator *this,Expression *args,nullopt_t *args_1)

{
  optional<slang::ast::SequenceRepetition> repetition;
  SimpleAssertionExpr *pSVar1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SimpleAssertionExpr *in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined4 local_20;
  
  pSVar1 = (SimpleAssertionExpr *)
           allocate(in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::optional<slang::ast::SequenceRepetition>::optional
            ((optional<slang::ast::SequenceRepetition> *)&stack0xffffffffffffffd0);
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._M_value.range.max.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(optional<unsigned_int>)in_stack_ffffffffffffffc8;
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._0_8_ = pSVar1;
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._16_4_ = in_stack_ffffffffffffffd0;
  slang::ast::SimpleAssertionExpr::SimpleAssertionExpr
            (in_stack_ffffffffffffffb0,(Expression *)CONCAT44(in_stack_ffffffffffffffac,local_20),
             repetition,SUB81(local_28,7));
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }